

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubcommandTest.cpp
# Opt level: O3

void __thiscall SubcommandProgram_HelpOrder_Test::TestBody(SubcommandProgram_HelpOrder_Test *this)

{
  input_t *piVar1;
  bool bVar2;
  long lVar3;
  AssertHelper local_70;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68 [2];
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> local_58 [16];
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  local_68[0].ptr_ = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"-h","");
  piVar1 = &(this->super_SubcommandProgram).super_TApp.args;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,local_68,
             local_48);
  if (local_68[0].ptr_ != local_58) {
    operator_delete(local_68[0].ptr_);
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    TApp::run((TApp *)this);
  }
  testing::Message::Message((Message *)local_68);
  testing::internal::AssertHelper::AssertHelper
            (&local_70,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
             ,0x211,
             "Expected: run() throws an exception of type CLI::CallForHelp.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_70,(Message *)local_68);
  testing::internal::AssertHelper::~AssertHelper(&local_70);
  if (local_68[0].ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar2 = testing::internal::IsTrue(true);
    if ((bVar2) &&
       (local_68[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_68[0].ptr_ + 8))();
    }
  }
  local_68[0].ptr_ = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"start","");
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"-h","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,local_68,
             &stack0xffffffffffffffd8);
  lVar3 = 0;
  do {
    if (local_38 + lVar3 != *(undefined1 **)((long)local_48 + lVar3)) {
      operator_delete(*(undefined1 **)((long)local_48 + lVar3));
    }
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x40);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    TApp::run((TApp *)this);
  }
  testing::Message::Message((Message *)local_68);
  testing::internal::AssertHelper::AssertHelper
            (&local_70,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
             ,0x214,
             "Expected: run() throws an exception of type CLI::CallForHelp.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_70,(Message *)local_68);
  testing::internal::AssertHelper::~AssertHelper(&local_70);
  if (local_68[0].ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar2 = testing::internal::IsTrue(true);
    if ((bVar2) &&
       (local_68[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_68[0].ptr_ + 8))();
    }
  }
  local_68[0].ptr_ = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"-h","");
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"start","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,local_68,
             &stack0xffffffffffffffd8);
  lVar3 = 0;
  do {
    if (local_38 + lVar3 != *(undefined1 **)((long)local_48 + lVar3)) {
      operator_delete(*(undefined1 **)((long)local_48 + lVar3));
    }
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x40);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    TApp::run((TApp *)this);
  }
  testing::Message::Message((Message *)local_68);
  testing::internal::AssertHelper::AssertHelper
            (&local_70,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
             ,0x217,
             "Expected: run() throws an exception of type CLI::CallForHelp.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_70,(Message *)local_68);
  testing::internal::AssertHelper::~AssertHelper(&local_70);
  if (local_68[0].ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar2 = testing::internal::IsTrue(true);
    if ((bVar2) &&
       (local_68[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_68[0].ptr_ + 8))();
    }
  }
  return;
}

Assistant:

TEST_F(SubcommandProgram, HelpOrder) {

    args = {"-h"};
    EXPECT_THROW(run(), CLI::CallForHelp);

    args = {"start", "-h"};
    EXPECT_THROW(run(), CLI::CallForHelp);

    args = {"-h", "start"};
    EXPECT_THROW(run(), CLI::CallForHelp);
}